

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.cpp
# Opt level: O0

bool ustringToGuid(CBString *str,EFI_GUID *guid)

{
  int iVar1;
  char *pcVar2;
  undefined1 local_70 [4];
  int err;
  uint p10;
  uint p9;
  uint p8;
  uint p7;
  uint p6;
  uint p5;
  uint p4;
  uint p3;
  uint p2;
  uint p1;
  unsigned_long p0;
  EFI_GUID *guid_local;
  CBString *str_local;
  
  p0 = (unsigned_long)guid;
  guid_local = (EFI_GUID *)str;
  pcVar2 = Bstrlib::CBString::toLocal8Bit(str);
  iVar1 = __isoc99_sscanf(pcVar2,"%08lX-%04X-%04X-%02X%02X-%02X%02X%02X%02X%02X%02X",&p2,&p3,&p4,&p5
                          ,&p6,&p7,&p8,&p9,&p10,&err,local_70);
  if (iVar1 != 0) {
    *(uint *)p0 = p2;
    *(undefined2 *)(p0 + 4) = (undefined2)p3;
    *(undefined2 *)(p0 + 6) = (undefined2)p4;
    *(undefined1 *)(p0 + 8) = (undefined1)p5;
    *(undefined1 *)(p0 + 9) = (undefined1)p6;
    *(undefined1 *)(p0 + 10) = (undefined1)p7;
    *(undefined1 *)(p0 + 0xb) = (undefined1)p8;
    *(undefined1 *)(p0 + 0xc) = (undefined1)p9;
    *(undefined1 *)(p0 + 0xd) = (undefined1)p10;
    *(undefined1 *)(p0 + 0xe) = (undefined1)err;
    *(undefined1 *)(p0 + 0xf) = local_70[0];
  }
  return iVar1 != 0;
}

Assistant:

bool ustringToGuid(const UString & str, EFI_GUID & guid)
{
    unsigned long p0;
    unsigned p1, p2, p3, p4, p5, p6, p7, p8, p9, p10;
    
    int err = std::sscanf(str.toLocal8Bit(), "%08lX-%04X-%04X-%02X%02X-%02X%02X%02X%02X%02X%02X",
                          &p0, &p1, &p2, &p3, &p4, &p5, &p6, &p7, &p8, &p9, &p10);
    if (err == 0)
        return false;
    
    guid.Data1 = (UINT32)p0;
    guid.Data2 = (UINT16)p1;
    guid.Data3 = (UINT16)p2;
    guid.Data4[0] = (UINT8)p3;
    guid.Data4[1] = (UINT8)p4;
    guid.Data4[2] = (UINT8)p5;
    guid.Data4[3] = (UINT8)p6;
    guid.Data4[4] = (UINT8)p7;
    guid.Data4[5] = (UINT8)p8;
    guid.Data4[6] = (UINT8)p9;
    guid.Data4[7] = (UINT8)p10;
    
    return true;
}